

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O0

Error asmjit::v1_14::Formatter::formatFeature(String *sb,Arch arch,uint32_t featureId)

{
  char in_SIL;
  String *in_RDI;
  bool local_26;
  bool local_24;
  bool local_21;
  undefined3 in_stack_ffffffffffffffe4;
  Error local_c;
  
  local_21 = in_SIL == '\x01' || in_SIL == '\x02';
  if (local_21) {
    local_c = x86::FormatterInternal::formatFeature
                        (in_RDI,CONCAT13(in_SIL,in_stack_ffffffffffffffe4));
  }
  else {
    local_24 = true;
    if (in_SIL != '\x05' && in_SIL != '\v') {
      local_24 = in_SIL == '\a' || in_SIL == '\r';
    }
    local_26 = true;
    if (!local_24) {
      local_26 = in_SIL == '\x06' || in_SIL == '\f';
    }
    if (local_26) {
      local_c = arm::FormatterInternal::formatFeature
                          (in_RDI,CONCAT13(in_SIL,in_stack_ffffffffffffffe4));
    }
    else {
      local_c = 4;
    }
  }
  return local_c;
}

Assistant:

Error formatFeature(
  String& sb,
  Arch arch,
  uint32_t featureId) noexcept {

#if !defined(ASMJIT_NO_X86)
  if (Environment::isFamilyX86(arch))
    return x86::FormatterInternal::formatFeature(sb, featureId);
#endif

#if !defined(ASMJIT_NO_AARCH64)
  if (Environment::isFamilyARM(arch))
    return arm::FormatterInternal::formatFeature(sb, featureId);
#endif

  return kErrorInvalidArch;
}